

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AppendDirectoryForConfig
          (cmGlobalNinjaGenerator *this,string *prefix,string *config,string *suffix,string *dir)

{
  int iVar1;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  if (config->_M_string_length != 0) {
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x26])();
    if ((char)iVar1 != '\0') {
      local_50.View_._M_str = (prefix->_M_dataplus)._M_p;
      local_50.View_._M_len = prefix->_M_string_length;
      local_80.View_._M_str = (config->_M_dataplus)._M_p;
      local_80.View_._M_len = config->_M_string_length;
      cmStrCat<std::__cxx11::string>(&local_a0,&local_50,&local_80,suffix);
      std::__cxx11::string::append((string *)dir);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  return;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}